

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall PeleLM::compute_rhoRT(PeleLM *this,MultiFab *S,MultiFab *Press,int pComp)

{
  ostringstream *this_00;
  int iVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  MFIter mfi;
  Box local_324;
  double local_308 [10];
  Array4<const_double> local_2b8;
  Array4<double> local_278;
  Array4<const_double> local_238;
  Array4<const_double> local_1f8;
  Print local_1b8;
  
  dVar10 = amrex::ParallelDescriptor::second();
  amrex::MFIter::MFIter((MFIter *)&local_1b8,(FabArrayBase *)S,true);
  if ((int)local_1b8._32_4_ < (int)local_1b8._40_4_) {
    do {
      amrex::MFIter::tilebox(&local_324,(MFIter *)&local_1b8);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_1f8,&S->super_FabArray<amrex::FArrayBox>,(MFIter *)&local_1b8,3);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_2b8,&S->super_FabArray<amrex::FArrayBox>,(MFIter *)&local_1b8,first_spec);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_238,&S->super_FabArray<amrex::FArrayBox>,(MFIter *)&local_1b8,
                 NavierStokesBase::Temp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_278,&Press->super_FabArray<amrex::FArrayBox>,(MFIter *)&local_1b8,pComp);
      if (local_324.smallend.vect[2] <= local_324.bigend.vect[2]) {
        iVar1 = local_324.smallend.vect[2];
        do {
          if (local_324.smallend.vect[1] <= local_324.bigend.vect[1]) {
            lVar2 = (long)iVar1;
            pdVar5 = (double *)
                     ((long)local_2b8.p +
                     (lVar2 - local_2b8.begin.z) * local_2b8.kstride * 8 +
                     ((long)local_324.smallend.vect[1] - (long)local_2b8.begin.y) *
                     local_2b8.jstride * 8 + (long)local_324.smallend.vect[0] * 8 +
                     (long)local_2b8.begin.x * -8);
            lVar7 = (long)local_324.smallend.vect[1];
            do {
              if (local_324.smallend.vect[0] <= local_324.bigend.vect[0]) {
                pdVar6 = pdVar5;
                lVar8 = (long)local_324.smallend.vect[0];
                do {
                  dVar11 = local_1f8.p
                           [(lVar2 - local_1f8.begin.z) * local_1f8.kstride +
                            (lVar7 - local_1f8.begin.y) * local_1f8.jstride +
                            (lVar8 - local_1f8.begin.x)];
                  local_308[6] = 0.0;
                  local_308[7] = 0.0;
                  local_308[4] = 0.0;
                  local_308[5] = 0.0;
                  local_308[2] = 0.0;
                  local_308[3] = 0.0;
                  local_308[0] = 0.0;
                  local_308[1] = 0.0;
                  local_308[8] = 0.0;
                  lVar4 = 0;
                  pdVar3 = pdVar6;
                  do {
                    local_308[lVar4] = *pdVar3 * (1.0 / dVar11);
                    lVar4 = lVar4 + 1;
                    pdVar3 = pdVar3 + local_2b8.nstride;
                  } while (lVar4 != 9);
                  local_278.p
                  [(lVar2 - local_278.begin.z) * local_278.kstride +
                   (lVar7 - local_278.begin.y) * local_278.jstride + (lVar8 - local_278.begin.x)] =
                       dVar11 * 0.001 * 83144626.1815324 *
                       local_238.p
                       [(lVar2 - local_238.begin.z) * local_238.kstride +
                        (lVar7 - local_238.begin.y) * local_238.jstride +
                        (lVar8 - local_238.begin.x)] *
                       (local_308[8] * 0.03569643749553795 +
                       local_308[7] * 0.029399658963956014 +
                       local_308[6] * 0.030297521662727988 +
                       local_308[5] * 0.05879931792791203 +
                       local_308[4] * 0.06250390649415588 +
                       local_308[3] * 0.9920634920634921 +
                       local_308[2] * 0.055509297807382736 +
                       local_308[1] * 0.03125195324707794 + local_308[0] * 0.49603174603174605 + 0.0
                       ) * 0.1;
                  lVar8 = lVar8 + 1;
                  pdVar6 = pdVar6 + 1;
                } while (local_324.bigend.vect[0] + 1 != (int)lVar8);
              }
              lVar7 = lVar7 + 1;
              pdVar5 = pdVar5 + local_2b8.jstride;
            } while (local_324.bigend.vect[1] + 1 != (int)lVar7);
          }
          bVar9 = iVar1 != local_324.bigend.vect[2];
          iVar1 = iVar1 + 1;
        } while (bVar9);
      }
      amrex::MFIter::operator++((MFIter *)&local_1b8);
    } while ((int)local_1b8._32_4_ < (int)local_1b8._40_4_);
  }
  amrex::MFIter::~MFIter((MFIter *)&local_1b8);
  if (2 < NavierStokesBase::verbose) {
    dVar11 = amrex::ParallelDescriptor::second();
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    this_00 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)&(local_1b8.os)->field_0x0 + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"      PeleLM::compute_rhoRT(): lev: ",0x24);
    std::ostream::operator<<(this_00,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", time: ",8);
    std::ostream::_M_insert<double>(dVar11 - dVar10);
    local_308[0] = (double)CONCAT71(local_308[0]._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)local_308,1);
    amrex::Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
PeleLM::compute_rhoRT (const MultiFab& S,
                             MultiFab& Press,
                             int       pComp)
{
   AMREX_ASSERT(pComp<Press.nComp());

   const Real strt_time = ParallelDescriptor::second();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& rho     = S.const_array(mfi,Density);
         auto const& rhoY    = S.const_array(mfi,first_spec);
         auto const& T       = S.const_array(mfi,Temp);
         auto const& P       = Press.array(mfi, pComp);
         amrex::ParallelFor(bx, [rho, rhoY, T, P]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            getPGivenRTY( i, j, k, rho, rhoY, T, P );
         });
      }
   }

   if (verbose > 2)
   {
     const int IOProc   = ParallelDescriptor::IOProcessorNumber();
     Real      run_time = ParallelDescriptor::second() - strt_time;

     ParallelDescriptor::ReduceRealMax(run_time,IOProc);

     amrex::Print() << "      PeleLM::compute_rhoRT(): lev: " << level
                    << ", time: " << run_time << '\n';
   }
}